

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

action __thiscall
Search::search::predict
          (search *this,example *ec,ptag mytag,action *oracle_actions,size_t oracle_actions_cnt,
          ptag *condition_on,char *condition_on_names,action *allowed_actions,
          size_t allowed_actions_cnt,float *allowed_actions_cost,size_t learner_id,float weight)

{
  pointer *ppuVar1;
  uint uVar2;
  iterator __position;
  action_repr *paVar3;
  features *pfVar4;
  features *pfVar5;
  size_t sVar6;
  search_private *psVar7;
  action *pos;
  float loss;
  action_repr item;
  action a;
  uint local_44;
  features *local_40;
  float a_cost;
  
  a_cost = 0.0;
  pos = oracle_actions;
  a = search_predict(this->priv,ec,1,mytag,oracle_actions,oracle_actions_cnt,condition_on,
                     condition_on_names,allowed_actions,allowed_actions_cnt,allowed_actions_cost,
                     learner_id,&a_cost,weight);
  psVar7 = this->priv;
  if (psVar7->state == INIT_TEST) {
    __position._M_current =
         (psVar7->test_action_sequence).
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (psVar7->test_action_sequence).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&psVar7->test_action_sequence,
                 __position,&a);
    }
    else {
      *__position._M_current = a;
      ppuVar1 = &(psVar7->test_action_sequence).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
  }
  if (mytag != 0) {
    pfVar5 = (features *)(ulong)mytag;
    psVar7 = this->priv;
    paVar3 = (psVar7->ptag_to_action)._begin;
    if (pfVar5 < (features *)((long)(psVar7->ptag_to_action)._end - (long)paVar3 >> 4)) {
      pfVar4 = paVar3[(long)pfVar5].repr;
      if (pfVar4 != (features *)0x0) {
        features::delete_v(pfVar4);
        operator_delete((this->priv->ptag_to_action)._begin[(long)pfVar5].repr);
        psVar7 = this->priv;
      }
    }
    if ((psVar7->acset).use_passthrough_repr == true) {
      local_44 = a;
      local_40 = pfVar5;
      pfVar4 = (features *)operator_new(0x68);
      (pfVar4->values)._begin = (float *)0x0;
      (pfVar4->values)._end = (float *)0x0;
      (pfVar4->values).end_array = (float *)0x0;
      (pfVar4->values).erase_count = 0;
      (pfVar4->indicies)._begin = (unsigned_long *)0x0;
      (pfVar4->indicies)._end = (unsigned_long *)0x0;
      (pfVar4->indicies).end_array = (unsigned_long *)0x0;
      (pfVar4->indicies).erase_count = 0;
      (pfVar4->space_names)._begin =
           (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x0;
      (pfVar4->space_names)._end =
           (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x0;
      (pfVar4->space_names).end_array =
           (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x0;
      (pfVar4->space_names).erase_count = 0;
      pfVar4->sum_feat_sq = 0.0;
      features::deep_copy_from(pfVar4,&psVar7->last_action_repr);
      pfVar5 = local_40;
      uVar2 = local_44;
    }
    else {
      pfVar4 = (features *)0x0;
      uVar2 = a;
    }
    item.repr = pfVar5;
    item._0_8_ = pfVar4;
    push_at<Search::action_repr>
              ((Search *)&psVar7->ptag_to_action,(v_array<Search::action_repr> *)(ulong)uVar2,item,
               (size_t)pos);
  }
  psVar7 = this->priv;
  if (psVar7->auto_hamming_loss == true) {
    if (psVar7->use_action_costs == true) {
      loss = action_cost_loss(a,allowed_actions,allowed_actions_cost,allowed_actions_cnt);
      psVar7 = this->priv;
    }
    else {
      loss = 0.0;
      if (oracle_actions_cnt != 0) {
        sVar6 = 0;
        do {
          if (oracle_actions[sVar6] == a) goto LAB_0025fc88;
          sVar6 = sVar6 + 1;
        } while (oracle_actions_cnt != sVar6);
        loss = 1.0;
      }
    }
LAB_0025fc88:
    search_declare_loss(psVar7,loss);
  }
  return a;
}

Assistant:

action search::predict(example& ec, ptag mytag, const action* oracle_actions, size_t oracle_actions_cnt,
    const ptag* condition_on, const char* condition_on_names, const action* allowed_actions, size_t allowed_actions_cnt,
    const float* allowed_actions_cost, size_t learner_id, float weight)
{
  float a_cost = 0.;
  action a = search_predict(*priv, &ec, 1, mytag, oracle_actions, oracle_actions_cnt, condition_on, condition_on_names,
      allowed_actions, allowed_actions_cnt, allowed_actions_cost, learner_id, a_cost, weight);
  if (priv->state == INIT_TEST)
    priv->test_action_sequence.push_back(a);
  if (mytag != 0)
  {
    if (mytag < priv->ptag_to_action.size())
    {
      cdbg << "delete_v at " << mytag << endl;
      if (priv->ptag_to_action[mytag].repr != nullptr)
      {
        priv->ptag_to_action[mytag].repr->delete_v();
        delete priv->ptag_to_action[mytag].repr;
      }
    }
    if (priv->acset.use_passthrough_repr)
    {
      assert((mytag >= priv->ptag_to_action.size()) || (priv->ptag_to_action[mytag].repr == nullptr));
      push_at(priv->ptag_to_action, action_repr(a, &(priv->last_action_repr)), mytag);
    }
    else
      push_at(priv->ptag_to_action, action_repr(a, (features*)nullptr), mytag);
    cdbg << "push_at " << mytag << endl;
  }
  if (priv->auto_hamming_loss)
    loss(priv->use_action_costs ? action_cost_loss(a, allowed_actions, allowed_actions_cost, allowed_actions_cnt)
                                : action_hamming_loss(a, oracle_actions, oracle_actions_cnt));
  cdbg << "predict returning " << a << endl;
  return a;
}